

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O1

xmlNodePtr
xmlXIncludeCopyNode(xmlXIncludeCtxtPtr ctxt,xmlNodePtr elem,int copyChildren,xmlChar *targetBase)

{
  xmlElementType xVar1;
  bool bVar2;
  int iVar3;
  xmlXIncludeRefPtr pxVar4;
  xmlNodePtr pxVar5;
  xmlNodePtr pxVar6;
  xmlNodePtr pxVar7;
  xmlNodePtr parent;
  xmlNodePtr node;
  int iVar8;
  bool bVar9;
  xmlNodePtr local_60;
  int local_54;
  xmlNodePtr local_38;
  
  node = elem;
  if ((copyChildren == 0) || (node = elem->children, node != (xmlNodePtr)0x0)) {
    local_60 = (xmlNodePtr)0x0;
    parent = (xmlNodePtr)0x0;
    pxVar7 = (xmlNodePtr)0x0;
    iVar8 = 0;
    do {
      xVar1 = node->type;
      bVar9 = true;
      pxVar6 = pxVar7;
      if ((xVar1 == XML_DTD_NODE) || (xVar1 == XML_DOCUMENT_NODE)) {
LAB_001bb040:
        if (bVar9) {
          local_54 = 1;
          pxVar7 = pxVar6;
          if (node == elem) {
LAB_001bb0a5:
            local_38 = local_60;
          }
          else {
            pxVar5 = node->next;
            pxVar6 = node;
            while (node = pxVar5, node == (xmlNodePtr)0x0) {
              if (parent != (xmlNodePtr)0x0) {
                parent->last = pxVar7;
              }
              node = pxVar6->parent;
              if (node == elem) goto LAB_001bb0a5;
              iVar8 = iVar8 + -1;
              pxVar7 = parent;
              parent = parent->parent;
              pxVar6 = node;
              pxVar5 = node->next;
            }
            local_54 = 0;
          }
        }
        else {
          node = node->children;
          iVar8 = iVar8 + 1;
          local_54 = 2;
          pxVar7 = (xmlNodePtr)0x0;
          parent = pxVar6;
        }
      }
      else if (((xVar1 == XML_ELEMENT_NODE) &&
               ((node->ns != (xmlNs *)0x0 &&
                (iVar3 = xmlStrEqual(node->name,(xmlChar *)"include"), iVar3 != 0)))) &&
              ((iVar3 = xmlStrEqual(node->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
               iVar3 != 0 ||
               (iVar3 = xmlStrEqual(node->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude"),
               iVar3 != 0)))) {
        pxVar4 = xmlXIncludeExpandNode(ctxt,node);
        local_54 = 4;
        if (pxVar4 == (xmlXIncludeRefPtr)0x0) {
          bVar2 = false;
        }
        else {
          pxVar6 = pxVar4->inc;
          bVar2 = true;
          if (pxVar6 == (xmlNodePtr)0x0) {
            local_54 = 0;
          }
          else {
            do {
              pxVar5 = xmlStaticCopyNode(pxVar6,ctxt->doc,parent,1);
              if (pxVar5 == (xmlNodePtr)0x0) {
                ctxt->fatalErr = 1;
                ctxt->errNo = 2;
                ctxt->nbErrors = ctxt->nbErrors + 1;
                xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                                    (xmlError *)0x0);
                bVar2 = false;
                goto LAB_001bb10c;
              }
              if (local_60 == (xmlNodePtr)0x0) {
                local_60 = pxVar5;
              }
              if (pxVar7 == (xmlNodePtr)0x0) {
                if (parent != (xmlNodePtr)0x0) {
                  parent->children = pxVar5;
                }
              }
              else {
                pxVar7->next = pxVar5;
                pxVar5->prev = pxVar7;
              }
              if (iVar8 == 0 && targetBase != (xmlChar *)0x0) {
                xmlXIncludeBaseFixup(ctxt,pxVar6,pxVar5,targetBase);
              }
              pxVar6 = pxVar6->next;
              pxVar7 = pxVar5;
            } while (pxVar6 != (_xmlNode *)0x0);
            local_54 = 0;
            bVar2 = true;
          }
        }
LAB_001bb10c:
        bVar9 = true;
        pxVar6 = pxVar7;
        if (bVar2) goto LAB_001bb040;
      }
      else {
        pxVar6 = xmlStaticCopyNode(node,ctxt->doc,parent,2);
        if (pxVar6 != (xmlNodePtr)0x0) {
          if (local_60 == (xmlNodePtr)0x0) {
            local_60 = pxVar6;
          }
          if (pxVar7 == (xmlNodePtr)0x0) {
            if (parent != (xmlNodePtr)0x0) {
              parent->children = pxVar6;
            }
          }
          else {
            pxVar7->next = pxVar6;
            pxVar6->prev = pxVar7;
          }
          bVar9 = true;
          if (iVar8 == 0 && targetBase != (xmlChar *)0x0) {
            xmlXIncludeBaseFixup(ctxt,node,pxVar6,targetBase);
          }
          if (node->type != XML_ENTITY_REF_NODE) {
            bVar9 = node->children == (_xmlNode *)0x0;
          }
          goto LAB_001bb040;
        }
        ctxt->fatalErr = 1;
        ctxt->errNo = 2;
        ctxt->nbErrors = ctxt->nbErrors + 1;
        xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                            (xmlError *)0x0);
        local_54 = 4;
      }
    } while ((local_54 == 0) || (local_54 == 2));
    if (local_54 != 4) {
      return local_38;
    }
    xmlFreeNodeList(local_60);
  }
  return (xmlNodePtr)0x0;
}

Assistant:

static xmlNodePtr
xmlXIncludeCopyNode(xmlXIncludeCtxtPtr ctxt, xmlNodePtr elem,
                    int copyChildren, const xmlChar *targetBase) {
    xmlNodePtr result = NULL;
    xmlNodePtr insertParent = NULL;
    xmlNodePtr insertLast = NULL;
    xmlNodePtr cur;
    xmlNodePtr item;
    int depth = 0;

    if (copyChildren) {
        cur = elem->children;
        if (cur == NULL)
            return(NULL);
    } else {
        cur = elem;
    }

    while (1) {
        xmlNodePtr copy = NULL;
        int recurse = 0;

        if ((cur->type == XML_DOCUMENT_NODE) ||
            (cur->type == XML_DTD_NODE)) {
            ;
        } else if ((cur->type == XML_ELEMENT_NODE) &&
                   (cur->ns != NULL) &&
                   (xmlStrEqual(cur->name, XINCLUDE_NODE)) &&
                   ((xmlStrEqual(cur->ns->href, XINCLUDE_NS)) ||
                    (xmlStrEqual(cur->ns->href, XINCLUDE_OLD_NS)))) {
            xmlXIncludeRefPtr ref = xmlXIncludeExpandNode(ctxt, cur);

            if (ref == NULL)
                goto error;
            /*
             * TODO: Insert XML_XINCLUDE_START and XML_XINCLUDE_END nodes
             */
            for (item = ref->inc; item != NULL; item = item->next) {
                copy = xmlStaticCopyNode(item, ctxt->doc, insertParent, 1);
                if (copy == NULL) {
                    xmlXIncludeErrMemory(ctxt);
                    goto error;
                }

                if (result == NULL)
                    result = copy;
                if (insertLast != NULL) {
                    insertLast->next = copy;
                    copy->prev = insertLast;
                } else if (insertParent != NULL) {
                    insertParent->children = copy;
                }
                insertLast = copy;

                if ((depth == 0) && (targetBase != NULL))
                    xmlXIncludeBaseFixup(ctxt, item, copy, targetBase);
            }
        } else {
            copy = xmlStaticCopyNode(cur, ctxt->doc, insertParent, 2);
            if (copy == NULL) {
                xmlXIncludeErrMemory(ctxt);
                goto error;
            }

            if (result == NULL)
                result = copy;
            if (insertLast != NULL) {
                insertLast->next = copy;
                copy->prev = insertLast;
            } else if (insertParent != NULL) {
                insertParent->children = copy;
            }
            insertLast = copy;

            if ((depth == 0) && (targetBase != NULL))
                xmlXIncludeBaseFixup(ctxt, cur, copy, targetBase);

            recurse = (cur->type != XML_ENTITY_REF_NODE) &&
                      (cur->children != NULL);
        }

        if (recurse) {
            cur = cur->children;
            insertParent = insertLast;
            insertLast = NULL;
            depth += 1;
            continue;
        }

        if (cur == elem)
            return(result);

        while (cur->next == NULL) {
            if (insertParent != NULL)
                insertParent->last = insertLast;
            cur = cur->parent;
            if (cur == elem)
                return(result);
            insertLast = insertParent;
            insertParent = insertParent->parent;
            depth -= 1;
        }

        cur = cur->next;
    }

error:
    xmlFreeNodeList(result);
    return(NULL);
}